

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

SrcList * sqlite3SrcListDup(sqlite3 *db,SrcList *p,int flags)

{
  byte *pbVar1;
  ushort uVar2;
  u32 uVar3;
  undefined8 *puVar4;
  int *piVar5;
  long lVar6;
  undefined8 uVar7;
  SrcList *pSVar8;
  char *pcVar9;
  Select *pSVar10;
  ExprList *pEVar11;
  Expr *pEVar12;
  int iVar13;
  long lVar14;
  long lVar15;
  
  if (p != (SrcList *)0x0) {
    iVar13 = 0x50;
    if (0 < p->nSrc) {
      iVar13 = p->nSrc * 0x48 + 8;
    }
    pSVar8 = (SrcList *)sqlite3DbMallocRawNN(db,(long)iVar13);
    if (pSVar8 != (SrcList *)0x0) {
      uVar3 = p->nSrc;
      pSVar8->nAlloc = uVar3;
      pSVar8->nSrc = uVar3;
      if ((int)uVar3 < 1) {
        return pSVar8;
      }
      lVar15 = 0x48;
      lVar14 = 0;
      do {
        *(undefined4 *)((long)pSVar8->a + lVar15 + -0x30) =
             *(undefined4 *)((long)p->a + lVar15 + -0x30);
        if ((*(byte *)((long)p->a + lVar15 + -0x2f) & 4) == 0) {
          pcVar9 = *(char **)((long)p->a + lVar15 + -8);
          if ((*(byte *)((long)p->a + lVar15 + -0x2d) & 1) == 0) {
            pcVar9 = sqlite3DbStrDup(db,pcVar9);
          }
        }
        else {
          if (db == (sqlite3 *)0x0) {
            pcVar9 = (char *)sqlite3Malloc(0x18);
          }
          else {
            pcVar9 = (char *)sqlite3DbMallocRawNN(db,0x18);
          }
          if (pcVar9 != (char *)0x0) {
            puVar4 = *(undefined8 **)((long)p->a + lVar15 + -8);
            uVar7 = puVar4[1];
            *(undefined8 *)pcVar9 = *puVar4;
            *(undefined8 *)(pcVar9 + 8) = uVar7;
            *(undefined8 *)(pcVar9 + 0x10) = puVar4[2];
            pSVar10 = sqlite3SelectDup(db,*(Select **)pcVar9,flags);
            *(Select **)pcVar9 = pSVar10;
            if (pSVar10 != (Select *)0x0) goto LAB_0017e518;
            sqlite3DbFreeNN(db,pcVar9);
          }
          pbVar1 = (byte *)((long)pSVar8->a + lVar15 + -0x2f);
          *pbVar1 = *pbVar1 & 0xfb;
          pcVar9 = (char *)0x0;
        }
LAB_0017e518:
        *(char **)((long)pSVar8->a + lVar15 + -8) = pcVar9;
        pcVar9 = sqlite3DbStrDup(db,*(char **)((long)(p->a + -1) + lVar15));
        *(char **)((long)(pSVar8->a + -1) + lVar15) = pcVar9;
        pcVar9 = sqlite3DbStrDup(db,*(char **)((long)p->a + lVar15 + -0x40));
        *(char **)((long)pSVar8->a + lVar15 + -0x40) = pcVar9;
        *(undefined4 *)((long)pSVar8->a + lVar15 + -0x2c) =
             *(undefined4 *)((long)p->a + lVar15 + -0x2c);
        uVar2 = *(ushort *)((long)pSVar8->a + lVar15 + -0x2f);
        if ((uVar2 & 2) == 0) {
          if ((uVar2 & 8) != 0) {
            pEVar11 = sqlite3ExprListDup(db,*(ExprList **)((long)p->a + lVar15 + -0x20),flags);
            goto LAB_0017e584;
          }
          *(undefined4 *)((long)pSVar8->a + lVar15 + -0x20) =
               *(undefined4 *)((long)p->a + lVar15 + -0x20);
        }
        else {
          pEVar11 = (ExprList *)sqlite3DbStrDup(db,*(char **)((long)p->a + lVar15 + -0x20));
LAB_0017e584:
          *(ExprList **)((long)pSVar8->a + lVar15 + -0x20) = pEVar11;
        }
        piVar5 = *(int **)((long)p->a + lVar15 + -0x18);
        *(int **)((long)pSVar8->a + lVar15 + -0x18) = piVar5;
        if ((*(byte *)((long)pSVar8->a + lVar15 + -0x2e) & 2) != 0) {
          *piVar5 = *piVar5 + 1;
        }
        lVar6 = *(long *)((long)p->a + lVar15 + -0x38);
        *(long *)((long)pSVar8->a + lVar15 + -0x38) = lVar6;
        if (lVar6 != 0) {
          *(int *)(lVar6 + 0x2c) = *(int *)(lVar6 + 0x2c) + 1;
        }
        pEVar12 = *(Expr **)((long)p->a + lVar15 + -0x10);
        if ((*(byte *)((long)p->a + lVar15 + -0x2e) & 8) == 0) {
          if (pEVar12 == (Expr *)0x0) {
            pEVar12 = (Expr *)0x0;
          }
          else {
            pEVar12 = exprDup(db,pEVar12,flags,(EdupBuf *)0x0);
          }
        }
        else {
          pEVar12 = (Expr *)sqlite3IdListDup(db,(IdList *)pEVar12);
        }
        *(Expr **)((long)pSVar8->a + lVar15 + -0x10) = pEVar12;
        *(undefined8 *)((long)pSVar8->a + lVar15 + -0x28) =
             *(undefined8 *)((long)p->a + lVar15 + -0x28);
        lVar14 = lVar14 + 1;
        lVar15 = lVar15 + 0x48;
        if (p->nSrc <= lVar14) {
          return pSVar8;
        }
      } while( true );
    }
  }
  return (SrcList *)0x0;
}

Assistant:

SQLITE_PRIVATE SrcList *sqlite3SrcListDup(sqlite3 *db, const SrcList *p, int flags){
  SrcList *pNew;
  int i;
  int nByte;
  assert( db!=0 );
  if( p==0 ) return 0;
  nByte = sizeof(*p) + (p->nSrc>0 ? sizeof(p->a[0]) * (p->nSrc-1) : 0);
  pNew = sqlite3DbMallocRawNN(db, nByte );
  if( pNew==0 ) return 0;
  pNew->nSrc = pNew->nAlloc = p->nSrc;
  for(i=0; i<p->nSrc; i++){
    SrcItem *pNewItem = &pNew->a[i];
    const SrcItem *pOldItem = &p->a[i];
    Table *pTab;
    pNewItem->fg = pOldItem->fg;
    if( pOldItem->fg.isSubquery ){
      Subquery *pNewSubq = sqlite3DbMallocRaw(db, sizeof(Subquery));
      if( pNewSubq==0 ){
        assert( db->mallocFailed );
        pNewItem->fg.isSubquery = 0;
      }else{
        memcpy(pNewSubq, pOldItem->u4.pSubq, sizeof(*pNewSubq));
        pNewSubq->pSelect = sqlite3SelectDup(db, pNewSubq->pSelect, flags);
        if( pNewSubq->pSelect==0 ){
          sqlite3DbFree(db, pNewSubq);
          pNewSubq = 0;
          pNewItem->fg.isSubquery = 0;
        }
      }
      pNewItem->u4.pSubq = pNewSubq;
    }else if( pOldItem->fg.fixedSchema ){
      pNewItem->u4.pSchema = pOldItem->u4.pSchema;
    }else{
      pNewItem->u4.zDatabase = sqlite3DbStrDup(db, pOldItem->u4.zDatabase);
    }
    pNewItem->zName = sqlite3DbStrDup(db, pOldItem->zName);
    pNewItem->zAlias = sqlite3DbStrDup(db, pOldItem->zAlias);
    pNewItem->iCursor = pOldItem->iCursor;
    if( pNewItem->fg.isIndexedBy ){
      pNewItem->u1.zIndexedBy = sqlite3DbStrDup(db, pOldItem->u1.zIndexedBy);
    }else if( pNewItem->fg.isTabFunc ){
      pNewItem->u1.pFuncArg =
          sqlite3ExprListDup(db, pOldItem->u1.pFuncArg, flags);
    }else{
      pNewItem->u1.nRow = pOldItem->u1.nRow;
    }
    pNewItem->u2 = pOldItem->u2;
    if( pNewItem->fg.isCte ){
      pNewItem->u2.pCteUse->nUse++;
    }
    pTab = pNewItem->pSTab = pOldItem->pSTab;
    if( pTab ){
      pTab->nTabRef++;
    }
    if( pOldItem->fg.isUsing ){
      assert( pNewItem->fg.isUsing );
      pNewItem->u3.pUsing = sqlite3IdListDup(db, pOldItem->u3.pUsing);
    }else{
      pNewItem->u3.pOn = sqlite3ExprDup(db, pOldItem->u3.pOn, flags);
    }
    pNewItem->colUsed = pOldItem->colUsed;
  }
  return pNew;
}